

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

int addUpvalue(Compiler *compiler,uint8_t index,_Bool isLocal)

{
  int iVar1;
  char *pcVar2;
  byte in_DL;
  char in_SIL;
  long in_RDI;
  Upvalue *upvalue;
  int i;
  int upvalueCount;
  int local_1c;
  int local_4;
  
  iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0x14);
  local_1c = 0;
  while( true ) {
    if (iVar1 <= local_1c) {
      if (iVar1 == 0x100) {
        error((char *)0x106f1d);
        local_4 = 0;
      }
      else {
        *(byte *)(in_RDI + 0x201d + (long)iVar1 * 2) = in_DL & 1;
        *(char *)(in_RDI + 0x201c + (long)iVar1 * 2) = in_SIL;
        local_4 = *(int *)(*(long *)(in_RDI + 8) + 0x14);
        *(int *)(*(long *)(in_RDI + 8) + 0x14) = local_4 + 1;
      }
      return local_4;
    }
    pcVar2 = (char *)(in_RDI + 0x201c + (long)local_1c * 2);
    if ((*pcVar2 == in_SIL) && ((pcVar2[1] & 1U) == (in_DL & 1))) break;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

static int addUpvalue(Compiler* compiler, uint8_t index, bool isLocal) {
    /**
     * before we add a new upvalue,
     * we first check to see if the function already has an upvalue that closes over that variable:
     */
    int upvalueCount = compiler->function->upvalueCount;
    for (int i = 0; i < upvalueCount; i++) {
        Upvalue* upvalue = &compiler->upvalues[i];
        if (upvalue->index == index && upvalue->isLocal == isLocal) {
            return i;
        }
    }

    //ensure the compiler doesn’t overflow that limit:
    if (upvalueCount == UINT8_COUNT) {
        error("Too many closure variables in function.");
        return 0;
    }

    // if be functions hasn't the upvalue create new one
    compiler->upvalues[upvalueCount].isLocal = isLocal;
    compiler->upvalues[upvalueCount].index = index;
    return compiler->function->upvalueCount++;
}